

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForVariableDeclarationSyntax,slang::syntax::ForVariableDeclarationSyntax_const&>
          (BumpAllocator *this,ForVariableDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  DataTypeSyntax *pDVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ForVariableDeclarationSyntax *pFVar10;
  
  pFVar10 = (ForVariableDeclarationSyntax *)allocate(this,0x38,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->varKeyword).kind;
  uVar7 = (args->varKeyword).field_0x2;
  NVar8.raw = (args->varKeyword).numFlags.raw;
  uVar9 = (args->varKeyword).rawLen;
  pIVar3 = (args->varKeyword).info;
  pDVar4 = args->type;
  (pFVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pFVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pFVar10->super_SyntaxNode).parent = pSVar1;
  (pFVar10->super_SyntaxNode).previewNode = pSVar2;
  (pFVar10->varKeyword).kind = TVar6;
  (pFVar10->varKeyword).field_0x2 = uVar7;
  (pFVar10->varKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pFVar10->varKeyword).rawLen = uVar9;
  (pFVar10->varKeyword).info = pIVar3;
  pFVar10->type = pDVar4;
  (pFVar10->declarator).ptr = (args->declarator).ptr;
  return pFVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }